

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O0

int32_t ucptrie_internalU8PrevIndex_63(UCPTrie *trie,UChar32 c,uint8_t *start,uint8_t *src)

{
  int32_t iVar1;
  int local_40;
  int local_3c;
  int local_38;
  int32_t idx;
  int32_t length;
  int32_t i;
  uint8_t *src_local;
  uint8_t *start_local;
  UCPTrie *pUStack_10;
  UChar32 c_local;
  UCPTrie *trie_local;
  
  if ((long)src - (long)start < 8) {
    idx = (int)src - (int)start;
    src_local = start;
  }
  else {
    idx = 7;
    src_local = src + -7;
  }
  iVar1 = idx;
  _length = src;
  start_local._4_4_ = c;
  pUStack_10 = trie;
  start_local._4_4_ = utf8_prevCharSafeBody_63(src_local,0,&idx,c,-1);
  idx = iVar1 - idx;
  if (start_local._4_4_ < 0x10000) {
    local_38 = (uint)pUStack_10->index[(int)start_local._4_4_ >> 6] + (start_local._4_4_ & 0x3f);
  }
  else {
    if (start_local._4_4_ < 0x110000) {
      if ((int)start_local._4_4_ < pUStack_10->highStart) {
        local_3c = ucptrie_internalSmallIndex_63(pUStack_10,start_local._4_4_);
      }
      else {
        local_3c = pUStack_10->dataLength + -2;
      }
      local_40 = local_3c;
    }
    else {
      local_40 = pUStack_10->dataLength + -1;
    }
    local_38 = local_40;
  }
  return local_38 << 3 | idx;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucptrie_internalU8PrevIndex(const UCPTrie *trie, UChar32 c,
                            const uint8_t *start, const uint8_t *src) {
    int32_t i, length;
    // Support 64-bit pointers by avoiding cast of arbitrary difference.
    if ((src - start) <= 7) {
        i = length = (int32_t)(src - start);
    } else {
        i = length = 7;
        start = src - 7;
    }
    c = utf8_prevCharSafeBody(start, 0, &i, c, -1);
    i = length - i;  // Number of bytes read backward from src.
    int32_t idx = _UCPTRIE_CP_INDEX(trie, 0xffff, c);
    return (idx << 3) | i;
}